

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawfunc.cpp
# Opt level: O2

int main(void)

{
  VMStd vm;
  allocator local_89;
  string local_88;
  VM local_68;
  
  squall::VMStd::VMStd((VMStd *)&local_68,0x400);
  squall::VMStd::dofile((VMStd *)&local_68,"rawfunc.nut");
  std::__cxx11::string::string((string *)&local_88,"foo",&local_89);
  squall::TableBase::defraw
            ((TableBase *)
             local_68.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_88,foo);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"bar",&local_89);
  squall::TableBase::call<void>
            ((TableBase *)
             local_68.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  squall::VM::~VM(&local_68);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("rawfunc.nut");

        vm.defraw("foo", foo);
        vm.call<void>("bar");
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}